

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquery.cpp
# Opt level: O3

void __thiscall QSqlQuery::QSqlQuery(QSqlQuery *this,QSqlResult *result)

{
  QSqlQueryPrivate *pQVar1;
  QSqlResult *pQVar2;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_nullResult>_> *this_00;
  
  this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_nullResult>_> *)0x10;
  pQVar1 = (QSqlQueryPrivate *)operator_new(0x10);
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar1->sqlResult = result;
  if (result == (QSqlResult *)0x0) {
    pQVar2 = (QSqlResult *)
             QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_nullResult>_>::
             operator()(this_00);
    pQVar1->sqlResult = pQVar2;
  }
  this->d = pQVar1;
  return;
}

Assistant:

QSqlQuery::QSqlQuery(QSqlResult *result)
{
    d = new QSqlQueryPrivate(result);
}